

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

string * __thiscall Color::colorize(string *__return_storage_ptr__,Color *this,string *input)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  _colorize(this,__return_storage_ptr__,input);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input) const
{
  std::string result;
  _colorize (result, input);
  return result;
}